

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  pointer pbVar1;
  bool bVar2;
  BadNameString *pBVar3;
  pointer __str;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  string pos_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  short_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  short_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  short_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pos_name._M_dataplus._M_p = (pointer)&pos_name.field_2;
  pos_name._M_string_length = 0;
  long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pos_name.field_2._M_local_buf[0] = '\0';
  __str = (input->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__str == pbVar1) {
      ::std::
      _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
      ::
      _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
                ((_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                  *)__return_storage_ptr__,&short_names,&long_names,&pos_name);
      ::std::__cxx11::string::~string((string *)&pos_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&long_names);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&short_names);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)&name,__str);
    if (name._M_string_length != 0) {
      if (name._M_string_length != 1) {
        if (*name._M_dataplus._M_p == '-') {
          if (name._M_dataplus._M_p[1] != 0x2d) {
            if (name._M_string_length != 2) {
              pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
              ::std::__cxx11::string::string((string *)&local_50,&name);
              BadNameString::MissingDash(pBVar3,&local_50);
              __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
            }
            if ((byte)name._M_dataplus._M_p[1] < 0x22) {
              pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
              ::std::__cxx11::string::string((string *)&local_70,&name);
              BadNameString::OneCharName(pBVar3,&local_70);
              __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
            }
            local_110._M_dataplus._M_p._0_4_ = 1;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &short_names,(int *)&local_110,name._M_dataplus._M_p + 1);
            goto LAB_00182323;
          }
        }
        if (2 < name._M_string_length) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_110,&name,0,2);
          bVar2 = ::std::operator==(&local_110,"--");
          ::std::__cxx11::string::~string((string *)&local_110);
          if (bVar2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_110,&name,2,0xffffffffffffffff);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&name,&local_110);
            ::std::__cxx11::string::~string((string *)&local_110);
            bVar2 = valid_name_string(&name);
            if (!bVar2) {
              pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
              ::std::__cxx11::string::string((string *)&local_90,&name);
              BadNameString::BadLongName(pBVar3,&local_90);
              __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&long_names,&name);
            goto LAB_00182323;
          }
        }
      }
      bVar2 = ::std::operator==(&name,"-");
      if (bVar2) {
LAB_001823b3:
        pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_b0,&name);
        BadNameString::ReservedName(pBVar3,&local_b0);
        __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
      }
      bVar2 = ::std::operator==(&name,"--");
      if (bVar2) goto LAB_001823b3;
      bVar2 = ::std::operator==(&name,"++");
      if (bVar2) goto LAB_001823b3;
      if (pos_name._M_string_length != 0) {
        pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_d0,&name);
        BadNameString::MultiPositionalNames(pBVar3,&local_d0);
        __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
      }
      bVar2 = valid_name_string(&name);
      if (!bVar2) {
        pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_f0,&name);
        BadNameString::BadPositionalName(pBVar3,&local_f0);
        __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pos_name,&name);
    }
LAB_00182323:
    ::std::__cxx11::string::~string((string *)&name);
    __str = __str + 1;
  } while( true );
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else if(name.length() > 2)
                throw BadNameString::MissingDash(name);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty())
                throw BadNameString::MultiPositionalNames(name);
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}